

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# data-source.cc
# Opt level: O0

void __thiscall SpriteBase::~SpriteBase(SpriteBase *this)

{
  SpriteBase *this_local;
  
  ~SpriteBase(this);
  operator_delete(this,0x40);
  return;
}

Assistant:

SpriteBase::~SpriteBase() {
  if (data != nullptr) {
    delete[] data;
    data = nullptr;
  }
}